

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

bool __thiscall ON_HatchLoop::IsValid(ON_HatchLoop *this,ON_TextLog *text_log)

{
  ON_Curve *pOVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  ON_BoundingBox box;
  double local_98;
  double local_80;
  double local_68;
  ON_BoundingBox local_60;
  
  pOVar1 = this->m_p2dCurve;
  bVar4 = pOVar1 != (ON_Curve *)0x0;
  if (text_log != (ON_TextLog *)0x0 && !(bool)bVar4) {
    ON_TextLog::Print(text_log,"2d loop curve is nullptr\n");
  }
  if (pOVar1 != (ON_Curve *)0x0) {
    iVar2 = (*(this->m_p2dCurve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])
                      (this->m_p2dCurve,text_log);
    bVar4 = (byte)iVar2;
    if (text_log != (ON_TextLog *)0x0 && bVar4 == 0) {
      ON_TextLog::Print(text_log,"Loop curve is not valid\n");
    }
  }
  if (bVar4 != 0) {
    ON_BoundingBox::ON_BoundingBox(&local_60);
    bVar4 = 0;
    ON_Geometry::GetBoundingBox(&this->m_p2dCurve->super_ON_Geometry,&local_60,false);
    ON_BoundingBox::Max(&local_60);
    ON_BoundingBox::Min(&local_60);
    if ((local_68 == local_80) && (!NAN(local_68) && !NAN(local_80))) {
      ON_BoundingBox::Max(&local_60);
      bVar4 = -(local_98 == 0.0) & 1;
    }
    if ((text_log != (ON_TextLog *)0x0) && (bVar4 == 0)) {
      ON_TextLog::Print(text_log,"2d loop curve has non-zero z coordinates\n");
    }
  }
  bVar3 = this->m_type < 2;
  if ((text_log == (ON_TextLog *)0x0 || bVar3) || (~bVar4 & 1) != 0) {
    bVar3 = (bool)(bVar4 & bVar3);
  }
  else {
    bVar3 = false;
    ON_TextLog::Print(text_log,"Loop type is invalid.\n");
  }
  return bVar3;
}

Assistant:

bool ON_HatchLoop::IsValid( ON_TextLog* text_log) const
{
  bool rc = m_p2dCurve != nullptr;
  if( !rc)
  {
    if( text_log)
      text_log->Print( "2d loop curve is nullptr\n");
  }
  if( rc)
  {
    rc = m_p2dCurve->IsValid( text_log);
    if( !rc)
    {
      if( text_log)
        text_log->Print( "Loop curve is not valid\n");
    }
  }

  if(rc)
  {
  }

  if( rc)
  {
    ON_BoundingBox box;
    m_p2dCurve->GetBoundingBox( box);
    rc = ( box.Max().z == box.Min().z && box.Max().z == 0.0);
    if( !rc)
    {
      if( text_log)
        text_log->Print( "2d loop curve has non-zero z coordinates\n");
    }
  }

  if( rc && m_type != ltOuter && m_type != ltInner)
  {
    if( text_log)
      text_log->Print( "Loop type is invalid.\n");
    rc = false;
  }

  return rc;
}